

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVector<ImGuiViewport_*> *pIVar2;
  undefined8 *puVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var6;
  ImGuiViewportP *pIVar7;
  ImGuiWindow *pIVar8;
  char *__s1;
  ImGuiViewport **ppIVar9;
  ImGuiWindow **ppIVar10;
  unsigned_short *puVar11;
  bool bVar12;
  ImVec2 IVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ImGuiContext *pIVar20;
  ImGuiContext *pIVar21;
  ImU32 IVar22;
  ImGuiContext *g_4;
  ImGuiWindow *pIVar23;
  ImGuiWindow *pIVar24;
  ImDrawList *pIVar25;
  ImGuiViewport **ppIVar26;
  ImGuiWindow **ppIVar27;
  unsigned_short *__dest;
  byte bVar28;
  int iVar29;
  char *pcVar30;
  char *label;
  ImGuiContext *ctx;
  ulong uVar31;
  ImGuiContext *g;
  long lVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  ImRect outer;
  ImRect inner;
  ImVec4 local_a8;
  ImGuiContext *local_90;
  undefined1 local_88 [16];
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar20 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    p_Var6 = (GImGui->PlatformIO).Platform_SetImeInputPos;
    if (p_Var6 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
      fVar36 = (GImGui->PlatformImeLastPos).x;
      if ((((fVar36 == 3.4028235e+38) && (!NAN(fVar36))) ||
          (fVar36 = (GImGui->PlatformImePos).x - fVar36,
          fVar37 = (GImGui->PlatformImePos).y - (GImGui->PlatformImeLastPos).y,
          0.0001 < fVar36 * fVar36 + fVar37 * fVar37)) &&
         ((pIVar7 = GImGui->PlatformImePosViewport, pIVar7 != (ImGuiViewportP *)0x0 &&
          (pIVar7->PlatformWindowCreated == true)))) {
        (*p_Var6)(&pIVar7->super_ImGuiViewport,GImGui->PlatformImePos);
        pIVar20->PlatformImeLastPos = pIVar20->PlatformImePos;
        pIVar20->PlatformImePosViewport = (ImGuiViewportP *)0x0;
      }
    }
    pIVar21 = GImGui;
    iVar34 = (GImGui->CurrentWindowStack).Size;
    while (1 < iVar34) {
      End();
      iVar34 = (pIVar21->CurrentWindowStack).Size;
    }
    pIVar20->WithinFrameScopeWithImplicitWindow = false;
    local_90 = pIVar20;
    pIVar23 = pIVar20->CurrentWindow;
    if ((pIVar23 != (ImGuiWindow *)0x0) && (pIVar23->WriteAccessed == false)) {
      pIVar23->Active = false;
    }
    End();
    pIVar20 = GImGui;
    pIVar23 = GetTopMostPopupModal();
    local_78 = (ImVec2)pIVar20->NavWindowingTargetAnim;
    pIVar24 = (ImGuiWindow *)((ulong)pIVar23 | (ulong)local_78);
    if ((pIVar24 != (ImGuiWindow *)0x0) && (0 < (pIVar20->Viewports).Size)) {
      lVar32 = 0;
      local_88._0_8_ = (0x31 - (ulong)(pIVar23 == (ImGuiWindow *)0x0)) * 0x10;
      do {
        pIVar7 = (pIVar20->Viewports).Data[lVar32];
        if ((((pIVar23 == (ImGuiWindow *)0x0) || (pIVar7 != pIVar23->Viewport)) &&
            ((pIVar20->NavWindowingList == (ImGuiWindow *)0x0 ||
             (pIVar7 != pIVar20->NavWindowingList->Viewport)))) &&
           ((pIVar20->NavWindowingTargetAnim == (ImGuiWindow *)0x0 ||
            (pIVar7 != pIVar20->NavWindowingTargetAnim->Viewport)))) {
          pIVar25 = GetViewportDrawList(pIVar7,1,"##Foreground");
          puVar3 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + local_88._0_8_);
          local_a8._0_8_ = *puVar3;
          uVar15 = puVar3[1];
          local_a8.w = (float)((ulong)uVar15 >> 0x20);
          local_a8.z = (float)uVar15;
          local_a8.w = pIVar20->DimBgRatio * (GImGui->Style).Alpha * local_a8.w;
          IVar22 = ColorConvertFloat4ToU32(&local_a8);
          IVar4 = (pIVar7->super_ImGuiViewport).Pos;
          IVar5 = (pIVar7->super_ImGuiViewport).Size;
          local_a8.y = IVar5.y + IVar4.y;
          local_a8.x = IVar5.x + IVar4.x;
          ImDrawList::AddRectFilled
                    (pIVar25,&(pIVar7->super_ImGuiViewport).Pos,(ImVec2 *)&local_a8,IVar22,0.0,0xf);
        }
        lVar32 = lVar32 + 1;
        pIVar24 = (ImGuiWindow *)(long)(pIVar20->Viewports).Size;
      } while (lVar32 < (long)pIVar24);
    }
    if (local_78 != (ImVec2)0x0) {
      pIVar23 = pIVar20->NavWindowingTargetAnim;
      pIVar24 = FindFrontMostVisibleChildWindow(pIVar24);
      pIVar25 = pIVar24->DrawList;
      ImDrawList::PushClipRectFullScreen(pIVar25);
      pIVar24 = pIVar23->RootWindowDockStop;
      if (((pIVar24->field_0x43a & 1) != 0) && (pIVar8 = pIVar23->RootWindow, pIVar8 != pIVar24)) {
        local_78 = pIVar8->Pos;
        uStack_70 = 0;
        local_88._4_4_ = (pIVar8->Size).y + local_78.y;
        local_88._0_4_ = (pIVar8->Size).x + local_78.x;
        local_88._8_8_ = 0;
        local_58 = pIVar24->Pos;
        uStack_50 = 0;
        local_a8.x = (GImGui->Style).Colors[0x30].x;
        local_a8.y = (GImGui->Style).Colors[0x30].y;
        uVar16 = (GImGui->Style).Colors[0x30].z;
        uVar17 = (GImGui->Style).Colors[0x30].w;
        local_48.y = (pIVar24->Size).y + local_58.y;
        local_48.x = (pIVar24->Size).x + local_58.x;
        uStack_40 = 0;
        local_a8.w = pIVar20->DimBgRatio * (GImGui->Style).Alpha * (float)uVar17;
        local_a8.z = (float)uVar16;
        IVar22 = ColorConvertFloat4ToU32(&local_a8);
        auVar14 = local_88;
        outer.Max.x = (float)local_88._0_4_;
        outer.Max.y = (float)local_88._4_4_;
        outer.Min = local_78;
        inner.Max = local_48;
        inner.Min = local_58;
        local_88 = auVar14;
        RenderRectFilledWithHole(pIVar25,outer,inner,IVar22,(pIVar20->Style).WindowRounding);
      }
      fVar36 = pIVar23->WindowRounding;
      fVar37 = (pIVar20->Style).WindowRounding;
      uVar33 = -(uint)(fVar37 <= fVar36);
      local_88 = ZEXT416(~uVar33 & (uint)fVar37 | uVar33 & (uint)fVar36);
      fVar38 = (pIVar23->Pos).x;
      fVar39 = (pIVar23->Pos).y;
      fVar37 = pIVar20->FontSize;
      local_68.x = fVar38 - fVar37;
      local_68.y = fVar39 - fVar37;
      IStack_60.x = fVar37 + (pIVar23->Size).x + fVar38;
      IStack_60.y = fVar37 + (pIVar23->Size).y + fVar39;
      pIVar7 = pIVar23->Viewport;
      IVar4 = (pIVar7->super_ImGuiViewport).Pos;
      fVar38 = IVar4.x;
      fVar39 = IVar4.y;
      if ((local_68.x <= fVar38) && (local_68.y <= fVar39)) {
        IVar4 = (pIVar7->super_ImGuiViewport).Size;
        iVar34 = -(uint)(fVar38 + IVar4.x <= IStack_60.x);
        iVar35 = -(uint)(fVar39 + IVar4.y <= IStack_60.y);
        auVar14._4_4_ = iVar34;
        auVar14._0_4_ = iVar34;
        auVar14._8_4_ = iVar35;
        auVar14._12_4_ = iVar35;
        uVar33 = movmskpd((int)pIVar7,auVar14);
        if (((uVar33 & 1) != 0) && ((byte)((byte)uVar33 >> 1) != 0)) {
          fVar37 = -1.0 - fVar37;
          local_68.x = local_68.x - fVar37;
          local_68.y = local_68.y - fVar37;
          IStack_60.x = fVar37 + IStack_60.x;
          IStack_60.y = fVar37 + IStack_60.y;
          local_88 = ZEXT416((uint)fVar36);
        }
      }
      local_a8.x = (GImGui->Style).Colors[0x2f].x;
      local_a8.y = (GImGui->Style).Colors[0x2f].y;
      uVar18 = (GImGui->Style).Colors[0x2f].z;
      uVar19 = (GImGui->Style).Colors[0x2f].w;
      local_a8.w = pIVar20->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar19;
      local_a8.z = (float)uVar18;
      IVar22 = ColorConvertFloat4ToU32(&local_a8);
      ImDrawList::AddRect(pIVar25,&local_68,&IStack_60,IVar22,(float)local_88._0_4_,-1,3.0);
      ImDrawList::PopClipRect(pIVar25);
    }
    pIVar20 = GImGui;
    if ((local_90->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
      if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
        IVar22 = ImHashStr("###NavWindowingList",0,0);
        pIVar23 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar20->WindowsById,IVar22);
        pIVar20->NavWindowingList = pIVar23;
      }
      pIVar7 = *(pIVar20->Viewports).Data;
      uVar33 = (pIVar20->NextWindowData).Flags;
      (pIVar20->NextWindowData).Flags = uVar33 | 0x10;
      IVar4 = (pIVar7->super_ImGuiViewport).Size;
      IVar5.y = IVar4.y * 0.2;
      IVar5.x = IVar4.x * 0.2;
      (pIVar20->NextWindowData).SizeConstraintRect.Min = IVar5;
      (pIVar20->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar20->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar20->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar20->NextWindowData).SizeCallbackUserData = (void *)0x0;
      IVar4 = (pIVar7->super_ImGuiViewport).Pos;
      IVar5 = (pIVar7->super_ImGuiViewport).Size;
      (pIVar20->NextWindowData).Flags = uVar33 | 0x11;
      IVar13.y = IVar5.y * 0.5 + IVar4.y;
      IVar13.x = IVar5.x * 0.5 + IVar4.x;
      (pIVar20->NextWindowData).PosVal = IVar13;
      (pIVar20->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar20->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar20->NextWindowData).PosCond = 1;
      (pIVar20->NextWindowData).PosUndock = true;
      IVar4 = (pIVar20->Style).WindowPadding;
      fVar36 = IVar4.x;
      fVar37 = IVar4.y;
      local_a8.y = fVar37 + fVar37;
      local_a8.x = fVar36 + fVar36;
      PushStyleVar(1,(ImVec2 *)&local_a8);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      lVar32 = (long)(pIVar20->WindowsFocusOrder).Size;
      if (0 < lVar32) {
        do {
          pIVar23 = (pIVar20->WindowsFocusOrder).Data[lVar32 + -1];
          if (((pIVar23->Active == true) && (pIVar23->RootWindowDockStop == pIVar23)) &&
             (uVar33 = pIVar23->Flags, (uVar33 >> 0x13 & 1) == 0)) {
            __s1 = pIVar23->Name;
            pcVar30 = __s1;
            if (__s1 != (char *)0xffffffffffffffff) {
              do {
                if (*pcVar30 == '#') {
                  if (pcVar30[1] == '#') goto LAB_0015c5ae;
                }
                else if (*pcVar30 == '\0') goto LAB_0015c5ae;
                pcVar30 = pcVar30 + 1;
              } while (pcVar30 != (char *)0xffffffffffffffff);
              pcVar30 = (char *)0xffffffffffffffff;
            }
LAB_0015c5ae:
            label = __s1;
            if ((__s1 == pcVar30) && (label = "(Popup)", (uVar33 >> 0x1a & 1) == 0)) {
              if ((uVar33 >> 10 & 1) != 0) {
                iVar34 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar34 == 0) goto LAB_0015c5f8;
              }
              label = "(Dock node)";
              if (pIVar23->DockNodeAsHost == (ImGuiDockNode *)0x0) {
                label = "(Untitled)";
              }
            }
LAB_0015c5f8:
            local_a8.x = 0.0;
            local_a8.y = 0.0;
            Selectable(label,pIVar20->NavWindowingTarget == pIVar23,0,(ImVec2 *)&local_a8);
          }
          bVar12 = 1 < lVar32;
          lVar32 = lVar32 + -1;
        } while (bVar12);
      }
      End();
      PopStyleVar(1);
    }
    pIVar21 = local_90;
    pIVar20 = GImGui;
    if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
      GImGui->CurrentDpiScale = 1.0;
      pIVar20->CurrentViewport = (ImGuiViewportP *)0x0;
    }
    if (local_90->DragDropActive == true) {
      if ((local_90->DragDropPayload).DataFrameCount + 1 < local_90->FrameCount) {
        bVar28 = 1;
        if ((local_90->DragDropSourceFlags & 0x20) == 0) {
          bVar28 = (pIVar20->IO).MouseDown[local_90->DragDropMouseButton] ^ 1;
        }
      }
      else {
        bVar28 = 0;
      }
      if ((bVar28 != 0) || ((local_90->DragDropPayload).Delivery != false)) {
        ClearDragDrop();
      }
    }
    if ((pIVar21->DragDropActive == true) &&
       (pIVar21->DragDropSourceFrameCount < pIVar21->FrameCount)) {
      pIVar21->DragDropWithinSourceOrTarget = true;
      SetTooltip("...");
      pIVar21->DragDropWithinSourceOrTarget = false;
    }
    pIVar21->WithinFrameScope = false;
    pIVar21->FrameCountEnded = pIVar21->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    pIVar20 = GImGui;
    (GImGui->PlatformIO).MainViewport = &(*(GImGui->Viewports).Data)->super_ImGuiViewport;
    iVar34 = (pIVar20->PlatformIO).Viewports.Capacity;
    if (iVar34 < 0) {
      uVar33 = iVar34 / 2 + iVar34;
      uVar31 = 0;
      if (0 < (int)uVar33) {
        uVar31 = (ulong)uVar33;
      }
      if (pIVar20 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar20->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar26 = (ImGuiViewport **)(*GImAllocatorAllocFunc)(uVar31 * 8,GImAllocatorUserData);
      ppIVar9 = (pIVar20->PlatformIO).Viewports.Data;
      if (ppIVar9 != (ImGuiViewport **)0x0) {
        memcpy(ppIVar26,ppIVar9,(long)(pIVar20->PlatformIO).Viewports.Size << 3);
        ppIVar9 = (pIVar20->PlatformIO).Viewports.Data;
        if ((ppIVar9 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
      }
      (pIVar20->PlatformIO).Viewports.Data = ppIVar26;
      (pIVar20->PlatformIO).Viewports.Capacity = (int)uVar31;
    }
    (pIVar20->PlatformIO).Viewports.Size = 0;
    if (0 < (pIVar20->Viewports).Size) {
      lVar32 = 0;
      do {
        pIVar7 = (pIVar20->Viewports).Data[lVar32];
        pIVar7->LastPos = (pIVar7->super_ImGuiViewport).Pos;
        if ((pIVar7->LastFrameActive < pIVar20->FrameCount) ||
           ((pIVar7->super_ImGuiViewport).Size.x <= 0.0)) {
          if (lVar32 == 0) goto LAB_0015c819;
        }
        else if ((lVar32 == 0) || (0.0 < (pIVar7->super_ImGuiViewport).Size.y)) {
LAB_0015c819:
          pIVar23 = pIVar7->Window;
          if ((pIVar23 == (ImGuiWindow *)0x0) ||
             ((pIVar23->Active == true && (pIVar23->Hidden == false)))) {
            iVar34 = (pIVar20->PlatformIO).Viewports.Size;
            iVar35 = (pIVar20->PlatformIO).Viewports.Capacity;
            if (iVar34 == iVar35) {
              if (iVar35 == 0) {
                iVar29 = 8;
              }
              else {
                iVar29 = iVar35 / 2 + iVar35;
              }
              iVar34 = iVar34 + 1;
              if (iVar34 < iVar29) {
                iVar34 = iVar29;
              }
              if (iVar35 < iVar34) {
                if (GImGui != (ImGuiContext *)0x0) {
                  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar1 = *piVar1 + 1;
                }
                ppIVar26 = (ImGuiViewport **)
                           (*GImAllocatorAllocFunc)((long)iVar34 << 3,GImAllocatorUserData);
                ppIVar9 = (pIVar20->PlatformIO).Viewports.Data;
                if (ppIVar9 != (ImGuiViewport **)0x0) {
                  memcpy(ppIVar26,ppIVar9,(long)(pIVar20->PlatformIO).Viewports.Size << 3);
                  ppIVar9 = (pIVar20->PlatformIO).Viewports.Data;
                  if ((ppIVar9 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar1 = *piVar1 + -1;
                  }
                  (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
                }
                (pIVar20->PlatformIO).Viewports.Data = ppIVar26;
                (pIVar20->PlatformIO).Viewports.Capacity = iVar34;
              }
            }
            (pIVar20->PlatformIO).Viewports.Data[(pIVar20->PlatformIO).Viewports.Size] =
                 &pIVar7->super_ImGuiViewport;
            pIVar2 = &(pIVar20->PlatformIO).Viewports;
            pIVar2->Size = pIVar2->Size + 1;
          }
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < (pIVar20->Viewports).Size);
    }
    pIVar21 = local_90;
    pIVar7 = *(pIVar20->Viewports).Data;
    (pIVar7->super_ImGuiViewport).PlatformRequestResize = false;
    (pIVar7->super_ImGuiViewport).PlatformRequestClose = false;
    (pIVar7->super_ImGuiViewport).PlatformRequestMove = false;
    iVar34 = (local_90->WindowsSortBuffer).Capacity;
    if (iVar34 < 0) {
      uVar33 = iVar34 / 2 + iVar34;
      uVar31 = 0;
      if (0 < (int)uVar33) {
        uVar31 = (ulong)uVar33;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar27 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar31 * 8,GImAllocatorUserData);
      ppIVar10 = (pIVar21->WindowsSortBuffer).Data;
      if (ppIVar10 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar27,ppIVar10,(long)(pIVar21->WindowsSortBuffer).Size << 3);
        ppIVar10 = (pIVar21->WindowsSortBuffer).Data;
        if ((ppIVar10 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar10,GImAllocatorUserData);
      }
      (pIVar21->WindowsSortBuffer).Data = ppIVar27;
      (pIVar21->WindowsSortBuffer).Capacity = (int)uVar31;
    }
    (pIVar21->WindowsSortBuffer).Size = 0;
    iVar34 = (pIVar21->Windows).Size;
    if ((pIVar21->WindowsSortBuffer).Capacity < iVar34) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar27 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar34 << 3,GImAllocatorUserData);
      ppIVar10 = (pIVar21->WindowsSortBuffer).Data;
      if (ppIVar10 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar27,ppIVar10,(long)(pIVar21->WindowsSortBuffer).Size << 3);
        ppIVar10 = (pIVar21->WindowsSortBuffer).Data;
        if ((ppIVar10 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar10,GImAllocatorUserData);
      }
      (pIVar21->WindowsSortBuffer).Data = ppIVar27;
      (pIVar21->WindowsSortBuffer).Capacity = iVar34;
    }
    uVar33 = (pIVar21->Windows).Size;
    if (uVar33 != 0) {
      uVar31 = 0;
      do {
        pIVar23 = (pIVar21->Windows).Data[uVar31];
        if ((pIVar23->Active != true) || ((pIVar23->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(&pIVar21->WindowsSortBuffer,pIVar23);
        }
        uVar31 = uVar31 + 1;
        uVar33 = (pIVar21->Windows).Size;
      } while (uVar31 != uVar33);
    }
    iVar34 = (pIVar21->Windows).Capacity;
    iVar35 = (pIVar21->WindowsSortBuffer).Size;
    iVar29 = (pIVar21->WindowsSortBuffer).Capacity;
    ppIVar27 = (pIVar21->WindowsSortBuffer).Data;
    (pIVar21->WindowsSortBuffer).Size = uVar33;
    (pIVar21->WindowsSortBuffer).Capacity = iVar34;
    ppIVar10 = (pIVar21->Windows).Data;
    (pIVar21->Windows).Size = iVar35;
    (pIVar21->Windows).Capacity = iVar29;
    (pIVar21->Windows).Data = ppIVar27;
    (pIVar21->WindowsSortBuffer).Data = ppIVar10;
    (pIVar21->IO).MetricsActiveWindows = pIVar21->WindowsActiveCount;
    ((pIVar21->IO).Fonts)->Locked = false;
    (pIVar21->IO).MouseWheel = 0.0;
    (pIVar21->IO).MouseWheelH = 0.0;
    iVar34 = (pIVar21->IO).InputQueueCharacters.Capacity;
    if (iVar34 < 0) {
      iVar34 = iVar34 / 2 + iVar34;
      iVar35 = 0;
      if (0 < iVar34) {
        iVar35 = iVar34;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)
               (*GImAllocatorAllocFunc)((ulong)(uint)(iVar35 * 2),GImAllocatorUserData);
      puVar11 = (pIVar21->IO).InputQueueCharacters.Data;
      if (puVar11 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar11,(long)(pIVar21->IO).InputQueueCharacters.Size * 2);
        puVar11 = (pIVar21->IO).InputQueueCharacters.Data;
        if ((puVar11 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar11,GImAllocatorUserData);
      }
      (pIVar21->IO).InputQueueCharacters.Data = __dest;
      (pIVar21->IO).InputQueueCharacters.Capacity = iVar35;
    }
    (pIVar21->IO).InputQueueCharacters.Size = 0;
    (pIVar21->IO).NavInputs[0] = 0.0;
    (pIVar21->IO).NavInputs[1] = 0.0;
    (pIVar21->IO).NavInputs[2] = 0.0;
    (pIVar21->IO).NavInputs[3] = 0.0;
    (pIVar21->IO).NavInputs[4] = 0.0;
    (pIVar21->IO).NavInputs[5] = 0.0;
    (pIVar21->IO).NavInputs[6] = 0.0;
    (pIVar21->IO).NavInputs[7] = 0.0;
    (pIVar21->IO).NavInputs[8] = 0.0;
    (pIVar21->IO).NavInputs[9] = 0.0;
    (pIVar21->IO).NavInputs[10] = 0.0;
    (pIVar21->IO).NavInputs[0xb] = 0.0;
    (pIVar21->IO).NavInputs[0xc] = 0.0;
    (pIVar21->IO).NavInputs[0xd] = 0.0;
    (pIVar21->IO).NavInputs[0xe] = 0.0;
    (pIVar21->IO).NavInputs[0xf] = 0.0;
    (pIVar21->IO).NavInputs[0x10] = 0.0;
    (pIVar21->IO).NavInputs[0x11] = 0.0;
    (pIVar21->IO).NavInputs[0x12] = 0.0;
    (pIVar21->IO).NavInputs[0x13] = 0.0;
    (pIVar21->IO).NavInputs[0x14] = 0.0;
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    ErrorCheckEndFrame();

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget != NULL)
        NavUpdateWindowingOverlay();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}